

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# choc_JSON.h
# Opt level: O0

string * __thiscall
choc::json::getEscapedQuotedString_abi_cxx11_
          (string *__return_storage_ptr__,json *this,string_view s)

{
  char *utf8Text;
  allocator<char> local_1d1;
  string local_1d0 [32];
  UTF8Pointer local_1b0 [3];
  ostringstream local_198 [8];
  ostringstream result;
  undefined1 local_20 [8];
  string_view s_local;
  
  s_local._M_len = s._M_len;
  local_20 = (undefined1  [8])this;
  s_local._M_str = (char *)__return_storage_ptr__;
  std::__cxx11::ostringstream::ostringstream(local_198);
  std::operator<<((ostream *)local_198,'\"');
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            (local_1d0,(basic_string_view<char,_std::char_traits<char>_> *)local_20,&local_1d1);
  utf8Text = (char *)std::__cxx11::string::c_str();
  choc::text::UTF8Pointer::UTF8Pointer(local_1b0,utf8Text);
  writeWithEscapeCharacters<std::__cxx11::ostringstream>
            ((basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_198,
             local_1b0[0]);
  std::__cxx11::string::~string(local_1d0);
  std::allocator<char>::~allocator(&local_1d1);
  std::operator<<((ostream *)local_198,'\"');
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_198);
  return __return_storage_ptr__;
}

Assistant:

inline std::string getEscapedQuotedString (std::string_view s)
{
    std::ostringstream result;
    result << '"';
    writeWithEscapeCharacters (result, text::UTF8Pointer (std::string (s).c_str()));
    result << '"';
    return result.str();
}